

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,string *dir,cmMakefile *mf)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference filename;
  pointer this_01;
  reference ppVar5;
  string local_ed0 [32];
  undefined1 local_eb0 [8];
  ostringstream cmCTestLog_msg_7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  *handler;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  *__range2_1;
  undefined1 local_cc8 [8];
  ostringstream cmCTestLog_msg_6;
  string local_b50 [32];
  undefined1 local_b30 [8];
  ostringstream cmCTestLog_msg_5;
  string *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  Glob gl;
  undefined1 local_918 [8];
  ostringstream cmCTestLog_msg_4;
  cmAlphaNum local_7a0;
  cmAlphaNum local_770;
  undefined1 local_740 [8];
  string rexpr;
  undefined1 local_700 [8];
  ostringstream cmCTestLog_msg_3;
  string local_580 [7];
  bool erroroc;
  undefined1 local_560 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3e8 [32];
  undefined1 local_3c8 [8];
  ostringstream cmCTestLog_msg_1;
  cmAlphaNum local_250;
  cmAlphaNum local_220;
  undefined1 local_1f0 [8];
  string fname;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  bool found;
  cmMakefile *mf_local;
  string *dir_local;
  cmCTest *this_local;
  
  bVar2 = false;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"* Read custom CTest configuration directory: ");
  poVar3 = std::operator<<(poVar3,(string *)dir);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xbc8,pcVar4,false);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  cmAlphaNum::cmAlphaNum(&local_220,dir);
  cmAlphaNum::cmAlphaNum(&local_250,"/CTestCustom.cmake");
  cmStrCat<>((string *)local_1f0,&local_220,&local_250);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
  poVar3 = std::operator<<((ostream *)local_3c8,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_1f0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xbcb,pcVar4,false);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1f0);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
    poVar3 = std::operator<<((ostream *)local_560,"* Read custom CTest configuration file: ");
    poVar3 = std::operator<<(poVar3,(string *)local_1f0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xbcf,pcVar4,false);
    std::__cxx11::string::~string(local_580);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();
    bVar2 = cmMakefile::ReadListFile(mf,(string *)local_1f0);
    if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
      poVar3 = std::operator<<((ostream *)local_700,"Problem reading custom configuration: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1f0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xbd6,pcVar4,false);
      std::__cxx11::string::~string((string *)(rexpr.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
    }
    bVar2 = true;
    if (bVar1) {
      cmSystemTools::SetErrorOccurred();
    }
  }
  cmAlphaNum::cmAlphaNum(&local_770,dir);
  cmAlphaNum::cmAlphaNum(&local_7a0,"/CTestCustom.ctest");
  cmStrCat<>((string *)local_740,&local_770,&local_7a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_918);
  poVar3 = std::operator<<((ostream *)local_918,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_740);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xbdf,pcVar4,false);
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
  if ((!bVar2) && (bVar1 = cmsys::SystemTools::FileExists((string *)local_740), bVar1)) {
    cmsys::Glob::Glob((Glob *)&files);
    cmsys::Glob::RecurseOn((Glob *)&files);
    cmsys::Glob::FindFiles((Glob *)&files,(string *)local_740,(GlobMessages *)0x0);
    this_00 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&files);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
      poVar3 = std::operator<<((ostream *)local_b30,"* Read custom CTest configuration file: ");
      poVar3 = std::operator<<(poVar3,(string *)filename);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xbe8,pcVar4,false);
      std::__cxx11::string::~string(local_b50);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
      bVar2 = cmMakefile::ReadListFile(mf,filename);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc8);
        poVar3 = std::operator<<((ostream *)local_cc8,"Problem reading custom configuration: ");
        poVar3 = std::operator<<(poVar3,(string *)filename);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xbec,pcVar4,false);
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc8);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = true;
    cmsys::Glob::~Glob((Glob *)&files);
  }
  if (bVar2) {
    this_01 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    Private::GetNamedTestingHandlers_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                *)&__begin2_1,this_01);
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                        *)&__begin2_1);
    handler = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                        *)&__begin2_1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&handler), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator*(&__end2_1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_eb0);
      poVar3 = std::operator<<((ostream *)local_eb0,
                               "* Read custom CTest configuration vectors for handler: ");
      poVar3 = std::operator<<(poVar3,(string *)ppVar5);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar5->second);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xbf7,pcVar4,false);
      std::__cxx11::string::~string(local_ed0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_eb0);
      (**ppVar5->second->_vptr_cmCTestGenericHandler)(ppVar5->second,mf);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
      ::operator++(&__end2_1);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            *)&__begin2_1);
  }
  std::__cxx11::string::~string((string *)local_740);
  std::__cxx11::string::~string((string *)local_1f0);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const std::string& dir,
                                             cmMakefile* mf)
{
  bool found = false;
  cmCTestLog(this, DEBUG,
             "* Read custom CTest configuration directory: " << dir
                                                             << std::endl);

  std::string fname = cmStrCat(dir, "/CTestCustom.cmake");
  cmCTestLog(this, DEBUG, "* Check for file: " << fname << std::endl);
  if (cmSystemTools::FileExists(fname)) {
    cmCTestLog(this, DEBUG,
               "* Read custom CTest configuration file: " << fname
                                                          << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();

    if (!mf->ReadListFile(fname) || cmSystemTools::GetErrorOccurredFlag()) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading custom configuration: " << fname
                                                          << std::endl);
    }
    found = true;
    if (erroroc) {
      cmSystemTools::SetErrorOccurred();
    }
  }

  std::string rexpr = cmStrCat(dir, "/CTestCustom.ctest");
  cmCTestLog(this, DEBUG, "* Check for file: " << rexpr << std::endl);
  if (!found && cmSystemTools::FileExists(rexpr)) {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    for (const std::string& file : files) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration file: " << file
                                                            << std::endl);
      if (!mf->ReadListFile(file) || cmSystemTools::GetErrorOccurredFlag()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem reading custom configuration: " << file
                                                            << std::endl);
      }
    }
    found = true;
  }

  if (found) {
    for (auto& handler : this->Impl->GetNamedTestingHandlers()) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration vectors for handler: "
                   << handler.first << " (" << handler.second << ")"
                   << std::endl);
      handler.second->PopulateCustomVectors(mf);
    }
  }

  return 1;
}